

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

int __thiscall cppforth::Forth::accept(Forth *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  ForthStack<unsigned_int> *this_00;
  uint Value;
  uint uVar1;
  int extraout_EAX;
  Char *pCVar2;
  stringstream *psVar3;
  size_type __n;
  string line;
  
  requireDStackAvailable(this,2,"ACCEPT");
  this_00 = &this->dStack;
  Value = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  if (this->readFromSource == FromStdCin) {
    psVar3 = (stringstream *)&std::cin;
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x159598);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&line);
  }
  else {
    if (this->readFromSource != FromString) goto LAB_00115847;
    psVar3 = &this->std_cin;
    std::ios::clear((int)*(undefined8 *)(*(long *)&this->std_cin + -0x18) + (int)psVar3);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)psVar3,(string *)&line);
  }
  std::ios::clear((int)psVar3 + (int)*(undefined8 *)(*(long *)psVar3 + -0x18));
LAB_00115847:
  if (line._M_string_length < Value) {
    Value = (uint)line._M_string_length;
  }
  for (__n = 0; (uint)__n < Value; __n = __n + 1) {
    pCVar2 = (Char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::at(&line,__n);
    dataSpaceSet(this,(uint)__n + uVar1,*pCVar2);
  }
  ForthStack<unsigned_int>::setTop(this_00,Value);
  std::__cxx11::string::~string((string *)&line);
  return extraout_EAX;
}

Assistant:

void accept() {
			REQUIRE_DSTACK_AVAILABLE(2, "ACCEPT");
			auto bufferSize = SIZE_T(dStack.getTop()); pop();
			auto buffer = CAddr(dStack.getTop());
			std::string line{};
			switch (readFromSource) {
			case FromString:
				std_cin.clear();
				std::getline(std_cin, line);
				std_cin.clear();
				break;
			case FromStdCin:
				std::cin.clear();
				std::getline(std::cin, line);
				std::cin.clear();
				break;
			default:
				break;
			}
				auto copySize = std::min(line.length(), bufferSize);
				for (Cell i = 0; i < copySize; ++i) {
					dataSpaceSet(buffer + i, line.at(i));
				}
				dStack.setTop(static_cast<Cell>(copySize));
		}